

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search.C
# Opt level: O1

void __thiscall Search::findInFile(Search *this,string *path)

{
  string *psVar1;
  FILE *pFVar2;
  bool bVar3;
  int iVar4;
  FILE *__stream;
  char *pcVar5;
  size_t __n;
  void *pvVar6;
  size_t sVar7;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  int *piVar8;
  _Alloc_hider _Var9;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  ulong uVar10;
  bool bVar11;
  string_view fmt;
  format_args args;
  string_view fmt_00;
  string_view fmt_01;
  string_view fmt_02;
  string_view fmt_03;
  format_args args_00;
  format_args args_01;
  format_args args_02;
  format_args args_03;
  format_args args_04;
  format_args args_05;
  string_view fmt_04;
  string_view fmt_05;
  string_view fmt_06;
  string_view fmt_07;
  string_view fmt_08;
  string_view fmt_09;
  format_args args_06;
  format_args args_07;
  format_args args_08;
  format_args args_09;
  format_args args_10;
  format_args args_11;
  string_view fmt_10;
  Match pmatch;
  char s3 [1024];
  char buf [1024];
  string local_8c8;
  string *local_8a8;
  Filter *local_8a0;
  undefined1 local_898 [24];
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Stack_880;
  FILE *local_878;
  size_type local_870;
  string local_868;
  string *local_848;
  size_type sStack_840;
  undefined1 local_838 [1023];
  char cStack_439;
  string *local_438;
  code *pcStack_430;
  string local_428 [31];
  
  local_8a8 = path;
  std::__cxx11::string::string
            ((string *)&local_438,(path->_M_dataplus)._M_p,(allocator *)&local_8c8);
  local_838._16_2_ = 0x72;
  local_838._8_8_ = 1;
  local_838._0_8_ = (string *)(local_838 + 0x10);
  __stream = Utils::fopen((char *)&local_438,local_838);
  if ((string *)local_838._0_8_ != (string *)(local_838 + 0x10)) {
    operator_delete((void *)local_838._0_8_);
  }
  if (local_438 != local_428) {
    operator_delete(local_438);
  }
  pFVar2 = _stderr;
  local_878 = __stream;
  if (__stream == (FILE *)0x0) {
    local_8c8._M_dataplus._M_p = "ERROR:";
    local_8c8._M_string_length = 0xff000000000001;
    local_8c8.field_2._M_local_buf[0] = '\0';
    local_8c8.field_2._M_local_buf[4] = '\0';
    local_8c8.field_2._8_2_ = 1;
    local_8c8.field_2._M_local_buf[10] = '\0';
    piVar8 = __errno_location();
    Utils::strerror_abi_cxx11_((Utils *)local_898,*piVar8);
    local_428[0]._M_dataplus._M_p = (local_8a8->_M_dataplus)._M_p;
    local_428[0]._M_string_length = local_8a8->_M_string_length;
    pcStack_430 = ::fmt::v10::detail::value<fmt::v10::basic_format_context<fmt::v10::appender,char>>
                  ::
                  format_custom_arg<fmt::v10::detail::styled_arg<char[7]>,fmt::v10::formatter<fmt::v10::detail::styled_arg<char[7]>,char,void>>
    ;
    local_428[0].field_2._M_allocated_capacity = local_898._0_8_;
    local_428[0].field_2._8_8_ = local_898._8_8_;
    fmt_03.size_ = 0xddf;
    fmt_03.data_ = (char *)0x1e;
    args_05.field_1.args_ = in_R9.args_;
    args_05.desc_ = (unsigned_long_long)&local_438;
    local_438 = &local_8c8;
    ::fmt::v10::vformat_abi_cxx11_
              ((string *)local_838,(v10 *)"{} Failed to open file {} : {}",fmt_03,args_05);
    local_438 = (string *)local_838._0_8_;
    pcStack_430 = (code *)local_838._8_8_;
    fmt_09.size_ = 3;
    fmt_09.data_ = "{}\n";
    args_11.field_1.values_ =
         (value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *)&local_438;
    args_11.desc_ = 0xd;
    ::fmt::v10::vprint(pFVar2,fmt_09,args_11);
    if ((string *)local_838._0_8_ != (string *)(local_838 + 0x10)) {
      operator_delete((void *)local_838._0_8_);
    }
    if ((pointer)local_898._0_8_ != (pointer)(local_898 + 0x10)) {
      operator_delete((void *)local_898._0_8_);
    }
  }
  else {
    local_8a0 = &this->_filter;
    local_870 = 0;
    bVar11 = false;
    iVar4 = 0;
    do {
      __stream = local_878;
      pcVar5 = fgets((char *)&local_438,0x400,local_878);
      if (pcVar5 == (char *)0x0) break;
      __n = strlen((char *)&local_438);
      if (__n != 0) {
        do {
          if (((&cStack_439)[__n] != '\r') && ((&cStack_439)[__n] != '\n')) goto LAB_0010aa24;
          (&cStack_439)[__n] = '\0';
          __n = __n - 1;
        } while (__n != 0);
        __n = 0;
      }
LAB_0010aa24:
      if ((bVar11) || (this->_args->_ascii != false)) {
        bVar11 = false;
      }
      else {
        pvVar6 = memchr(&local_438,0,__n);
        bVar11 = pvVar6 != (void *)0x0;
      }
      local_898._16_8_ = (pointer)0x0;
      _Stack_880._M_current = (char *)0x0;
      local_898._0_8_ = (pointer)0x0;
      local_898._8_8_ = (pointer)0x0;
      local_838._0_8_ = (string *)(local_838 + 0x10);
      sVar7 = strlen((char *)&local_438);
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_838,&local_438,(long)&local_438 + sVar7);
      bVar3 = Filter::matchContent(local_8a0,(string *)local_838,(Match *)local_898);
      if ((string *)local_838._0_8_ != (string *)(local_838 + 0x10)) {
        operator_delete((void *)local_838._0_8_);
      }
      local_870 = local_870 + 1;
      if (bVar3) {
        bVar3 = Filter::printContent(local_8a0);
        pFVar2 = _stdout;
        if (bVar3) {
          if (!bVar11) {
            local_838._0_8_ = (local_8a8->_M_dataplus)._M_p;
            local_838._8_8_ = local_8a8->_M_string_length;
            local_838._16_8_ = local_870;
            args.field_1.values_ =
                 (value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *)local_838;
            args.desc_ = 0x1d;
            fmt_10.size_ = 10;
            fmt_10.data_ = "{} +{} : \"";
            ::fmt::v10::vprint(fmt_10,args);
            iVar4 = (*this->_vptr_Search[2])(this,&local_438,local_898);
            uVar10 = CONCAT44(extraout_var,iVar4);
            while( true ) {
              if (uVar10 < __n) {
                pcVar5 = (char *)((long)&local_438 + uVar10);
                local_868._M_dataplus._M_p = (pointer)&local_868.field_2;
                sVar7 = strlen(pcVar5);
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)&local_868,pcVar5,pcVar5 + sVar7);
                bVar3 = Filter::matchContent(local_8a0,&local_868,(Match *)local_898);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_868._M_dataplus._M_p != &local_868.field_2) {
                  operator_delete(local_868._M_dataplus._M_p);
                }
              }
              else {
                bVar3 = false;
              }
              pFVar2 = _stdout;
              if (bVar3 == false) break;
              iVar4 = (*this->_vptr_Search[2])(this,(long)&local_438 + uVar10,local_898);
              uVar10 = uVar10 + CONCAT44(extraout_var_00,iVar4);
            }
            if (uVar10 < __n) {
              Utils::strncpy_s(local_838,0x400,(char *)((long)&local_438 + uVar10),0x3ff);
              pFVar2 = _stdout;
              fmt_00.size_ = 0xc;
              fmt_00.data_ = (char *)0x3;
              args_01.field_1.values_ = in_R9.values_;
              args_01.desc_ = (unsigned_long_long)&local_848;
              local_848 = (string *)local_838;
              ::fmt::v10::vformat_abi_cxx11_(&local_8c8,(v10 *)0x12a115,fmt_00,args_01);
              local_848 = (string *)local_8c8._M_dataplus._M_p;
              sStack_840 = local_8c8._M_string_length;
              fmt_05.size_ = 3;
              fmt_05.data_ = "{}\n";
              args_07.field_1.values_ =
                   (value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *)&local_848;
              args_07.desc_ = 0xd;
              ::fmt::v10::vprint(pFVar2,fmt_05,args_07);
              psVar1 = &local_8c8;
              _Var9._M_p = local_8c8._M_dataplus._M_p;
            }
            else {
              args_03.field_1.values_ = in_R9.values_;
              args_03.desc_ = (unsigned_long_long)&local_8c8;
              ::fmt::v10::vformat_abi_cxx11_
                        ((string *)local_838,(v10 *)0x12b771,(string_view)ZEXT816(1),args_03);
              local_8c8._M_dataplus._M_p = (pointer)local_838._0_8_;
              local_8c8._M_string_length = local_838._8_8_;
              fmt_07.size_ = 3;
              fmt_07.data_ = "{}\n";
              args_09.field_1.values_ =
                   (value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *)&local_8c8;
              args_09.desc_ = 0xd;
              ::fmt::v10::vprint(pFVar2,fmt_07,args_09);
              psVar1 = (string *)local_838;
              _Var9._M_p = (pointer)local_838._0_8_;
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)_Var9._M_p != &psVar1->field_2) {
              operator_delete(_Var9._M_p);
            }
            iVar4 = this->_args->_extraContent;
            goto LAB_0010ae12;
          }
          local_8c8._M_dataplus._M_p = (local_8a8->_M_dataplus)._M_p;
          local_8c8._M_string_length = local_8a8->_M_string_length;
          fmt.size_ = 0xd;
          fmt.data_ = (char *)0x18;
          args_00.field_1.values_ = in_R9.values_;
          args_00.desc_ = (unsigned_long_long)&local_8c8;
          ::fmt::v10::vformat_abi_cxx11_
                    ((string *)local_838,(v10 *)"{} : binary file matches",fmt,args_00);
          local_8c8._M_dataplus._M_p = (pointer)local_838._0_8_;
          local_8c8._M_string_length = local_838._8_8_;
          fmt_04.size_ = 3;
          fmt_04.data_ = "{}\n";
          args_06.field_1.values_ =
               (value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *)&local_8c8;
          args_06.desc_ = 0xd;
          ::fmt::v10::vprint(pFVar2,fmt_04,args_06);
LAB_0010ad76:
          if ((string *)local_838._0_8_ != (string *)(local_838 + 0x10)) {
            operator_delete((void *)local_838._0_8_);
          }
        }
        else {
          if ((this->_args->_exec)._M_string_length == 0) {
            local_8c8._M_dataplus._M_p = (local_8a8->_M_dataplus)._M_p;
            local_8c8._M_string_length = local_8a8->_M_string_length;
            fmt_01.size_ = 0xd;
            fmt_01.data_ = (char *)0x2;
            args_02.field_1.values_ = in_R9.values_;
            args_02.desc_ = (unsigned_long_long)&local_8c8;
            ::fmt::v10::vformat_abi_cxx11_((string *)local_838,(v10 *)0x12b78d,fmt_01,args_02);
            local_8c8._M_dataplus._M_p = (pointer)local_838._0_8_;
            local_8c8._M_string_length = local_838._8_8_;
            fmt_06.size_ = 3;
            fmt_06.data_ = "{}\n";
            args_08.field_1.values_ =
                 (value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *)&local_8c8;
            args_08.desc_ = 0xd;
            ::fmt::v10::vprint(pFVar2,fmt_06,args_08);
            goto LAB_0010ad76;
          }
          (*this->_vptr_Search[4])(this,&this->_args->_exec,local_8a8);
        }
        bVar3 = false;
      }
      else {
LAB_0010ae12:
        pFVar2 = _stdout;
        bVar3 = true;
        if (0 < iVar4) {
          local_8c8._M_dataplus._M_p = (pointer)&local_438;
          fmt_02.size_ = 0xc;
          fmt_02.data_ = (char *)0x3;
          args_04.field_1.values_ = in_R9.values_;
          args_04.desc_ = (unsigned_long_long)&local_8c8;
          ::fmt::v10::vformat_abi_cxx11_((string *)local_838,(v10 *)"\t{}",fmt_02,args_04);
          local_8c8._M_dataplus._M_p = (pointer)local_838._0_8_;
          local_8c8._M_string_length = local_838._8_8_;
          fmt_08.size_ = 3;
          fmt_08.data_ = "{}\n";
          args_10.field_1.values_ =
               (value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *)&local_8c8;
          args_10.desc_ = 0xd;
          ::fmt::v10::vprint(pFVar2,fmt_08,args_10);
          if ((string *)local_838._0_8_ != (string *)(local_838 + 0x10)) {
            operator_delete((void *)local_838._0_8_);
          }
          iVar4 = iVar4 + -1;
        }
      }
      if ((pointer)local_898._0_8_ != (pointer)0x0) {
        operator_delete((void *)local_898._0_8_);
      }
      __stream = local_878;
    } while (bVar3);
  }
  if (__stream != (FILE *)0x0) {
    ::fclose(__stream);
  }
  return;
}

Assistant:

void Search::findInFile(std::string const & path) const
{
    std::unique_ptr<FILE, decltype(&fclose)> f(Utils::fopen(path.c_str(), "r"), &fclose);
    if (!f) {
        fmt::println(stderr, "{} Failed to open file {} : {}",
                    fmt::styled("ERROR:", fmt::fg(fmt::color::red)),
                    path,
                    Utils::strerror(errno));
        return;
    }

    char buf[BUF_SIZE];
    int lineno = 0;
    bool binary = false;
    int linesToPrint = 0;
    bool const nocolor = _args.noColor();
    while (fgets(buf, BUF_SIZE, f.get()) != nullptr) {
        // Remove trailing CR and LF characters
        size_t sz = strlen(buf);
        while (sz > 0 && (buf[sz - 1] == '\n' || buf[sz - 1] == '\r')) {
            buf[--sz] = '\0';
        }

        // Check for a binary file
        binary = !binary && !_args.ascii() && memchr(buf, 0, sz) != nullptr;

        ++lineno;
        Match pmatch;
        if (_filter.matchContent(buf, &pmatch)) {
            if (_filter.printContent()) {
                if (!binary) {

                    fmt::print("{} +{} : \"", path, lineno);

                    // Print content
                    size_t idx = printMatch(buf, pmatch, nocolor);

                    // Repeat search for more matches
                    while (idx < sz && _filter.matchContent(&buf[idx], &pmatch)) {
                        idx += printMatch(&buf[idx], pmatch, nocolor);
                    }

                    // The remainder of the line
                    if (idx < sz) {
                        char s3[BUF_SIZE];
                        Utils::strncpy_s(s3, BUF_SIZE, &buf[idx], BUF_SIZE - 1);
                        fmt::println("{}\"", s3);
                    }
                    else {
                        fmt::println("\"");
                    }

                    linesToPrint = _args.extraContent();
                }
                else {
                    // Print only file name and exit
                    fmt::println("{} : binary file matches", path);
                    break;
                }
            }
            else if (!_args.execCmd().empty()) {
                // Run the command and exit
                execCmd(_args.execCmd(), path);
                break;
            }
            else {
                // Print only file name and exit
                fmt::println("{}", path);
                break;
            }
        }

        // Print extra content
        if (linesToPrint > 0) {
            fmt::println("\t{}", buf);
            --linesToPrint;
        }
    }
}